

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

char * stbi_zlib_decode_noheader_malloc(char *buffer,int len,int *outlen)

{
  int iVar1;
  char *obuf;
  zbuf a;
  
  obuf = (char *)malloc(0x4000);
  if (obuf != (char *)0x0) {
    a.zbuffer_end = (uint8 *)(buffer + len);
    a.zbuffer = (uint8 *)buffer;
    iVar1 = do_zlib(&a,obuf,0x4000,1,0);
    if (iVar1 != 0) {
      if (outlen == (int *)0x0) {
        return a.zout_start;
      }
      *outlen = (int)a.zout - (int)a.zout_start;
      return a.zout_start;
    }
    free(a.zout_start);
  }
  return (char *)0x0;
}

Assistant:

char *stbi_zlib_decode_noheader_malloc(char const *buffer, int len, int *outlen)
{
   zbuf a;
   char *p = (char *) malloc(16384);
   if (p == NULL) return NULL;
   a.zbuffer = (uint8 *) buffer;
   a.zbuffer_end = (uint8 *) buffer+len;
   if (do_zlib(&a, p, 16384, 1, 0)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      free(a.zout_start);
      return NULL;
   }
}